

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O3

RGB colorOfPoint(Point *point,Triangle *triangle)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  
  uVar3 = (triangle->x).x;
  uVar7 = (triangle->x).y;
  uVar4 = (triangle->y).x;
  uVar8 = (triangle->y).y;
  fVar14 = (triangle->y).z;
  uVar5 = (triangle->z).x;
  uVar9 = (triangle->z).y;
  fVar1 = (triangle->z).z;
  uVar6 = point->x;
  uVar10 = point->y;
  fVar19 = point->z - fVar14;
  fVar2 = (triangle->x).z;
  fVar20 = ((float)uVar8 - (float)uVar7) * (fVar1 - fVar2) -
           (fVar14 - fVar2) * ((float)uVar9 - (float)uVar7);
  fVar18 = (fVar14 - fVar2) * ((float)uVar5 - (float)uVar3) -
           (fVar1 - fVar2) * ((float)uVar4 - (float)uVar3);
  fVar16 = ((float)uVar9 - (float)uVar7) * ((float)uVar4 - (float)uVar3) -
           ((float)uVar5 - (float)uVar3) * ((float)uVar8 - (float)uVar7);
  fVar15 = point->z - fVar1;
  fVar17 = fVar16 * fVar16 + fVar20 * fVar20 + fVar18 * fVar18;
  uVar11._0_1_ = (triangle->colorX).r;
  uVar11._1_1_ = (triangle->colorX).g;
  fVar19 = ((((float)uVar10 - (float)uVar8) * ((float)uVar5 - (float)uVar4) -
            ((float)uVar6 - (float)uVar4) * ((float)uVar9 - (float)uVar8)) * fVar16 +
           (((float)uVar9 - (float)uVar8) * fVar19 -
           (fVar1 - fVar14) * ((float)uVar10 - (float)uVar8)) * fVar20 +
           ((fVar1 - fVar14) * ((float)uVar6 - (float)uVar4) -
           fVar19 * ((float)uVar5 - (float)uVar4)) * fVar18) / fVar17;
  uVar12._0_1_ = (triangle->colorY).r;
  uVar12._1_1_ = (triangle->colorY).g;
  fVar17 = ((((float)uVar10 - (float)uVar9) * ((float)uVar3 - (float)uVar5) -
            ((float)uVar6 - (float)uVar5) * ((float)uVar7 - (float)uVar9)) * fVar16 +
           (((float)uVar7 - (float)uVar9) * fVar15 -
           (fVar2 - fVar1) * ((float)uVar10 - (float)uVar9)) * fVar20 +
           ((fVar2 - fVar1) * ((float)uVar6 - (float)uVar5) - fVar15 * ((float)uVar3 - (float)uVar5)
           ) * fVar18) / fVar17;
  uVar13._0_1_ = (triangle->colorZ).r;
  uVar13._1_1_ = (triangle->colorZ).g;
  fVar14 = (1.0 - fVar19) - fVar17;
  return (RGB)((uint3)(byte)((char)(int)((float)(uVar13 & 0xff) * fVar14) +
                            (char)(int)((float)(uVar12 & 0xff) * fVar17) +
                            (char)(int)((float)(uVar11 & 0xff) * fVar19)) |
              (uint3)(byte)((char)(int)((float)(uVar13 >> 8) * fVar14) +
                           (char)(int)((float)(uVar12 >> 8) * fVar17) +
                           (char)(int)((float)(uVar11 >> 8) * fVar19)) << 8 |
              (uint3)(byte)((char)(int)((float)(triangle->colorZ).b * fVar14) +
                           (char)(int)((float)(triangle->colorY).b * fVar17) +
                           (char)(int)((float)(triangle->colorX).b * fVar19)) << 0x10);
}

Assistant:

RGB colorOfPoint(Point const& point, Triangle const& triangle)
{
  float u;
  float v;

  Point v0 = triangle.x;
  Point v1 = triangle.y;
  Point v2 = triangle.z;

  Vector v0v1 = v1 - v0;
  Vector v0v2 = v2 - v0;

  Vector N = crossProduct(v0v1, v0v2);
  float denom = dotProduct(N, N);

  Vector C;

  Vector edge1 = v2 - v1;
  Vector vp1 = point - v1;
  C = crossProduct(edge1, vp1);
  u = dotProduct(N, C);

  Vector edge2 = v0 - v2;
  Vector vp2 = point - v2;
  C = crossProduct(edge2, vp2);
  v = dotProduct(N, C);

  u /= denom;
  v /= denom;

  return triangle.colorX * u + triangle.colorY * v + triangle.colorZ * (1 - u - v);
}